

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.cpp
# Opt level: O3

void __thiscall
chrono::ChLoadXYZnodeBody::ComputeQ(ChLoadXYZnodeBody *this,ChState *state_x,ChStateDelta *state_w)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  element_type *peVar5;
  double *__dest;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  uint uVar17;
  ChFrameMoving<double> *pCVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar19;
  double *pdVar20;
  uint uVar21;
  pointer psVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  _func_int **pp_Var47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar51;
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  ChVector<double> loc_ftorque;
  ChVector<double> abs_force;
  ChFrameMoving<double> rel_AB;
  long local_480;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_478;
  ChQuaternion<double> local_458;
  ChFrameMoving<double> CStack_438;
  ChFrameMoving<double> local_338;
  ChVector<double> local_238;
  ChFrameMoving<double> local_220;
  ChFrameMoving<double> local_128;
  
  psVar22 = (this->super_ChLoadCustomMultiple).loadables.
            super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar5 = (psVar22->super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar5 == (element_type *)0x0) {
LAB_005cee96:
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pCVar18 = (ChFrameMoving<double> *)0x0;
  }
  else {
    pCVar18 = (ChFrameMoving<double> *)
              __dynamic_cast(peVar5,&ChLoadable::typeinfo,&ChNodeXYZ::typeinfo);
    if (pCVar18 == (ChFrameMoving<double> *)0x0) goto LAB_005cee96;
    this_00 = (psVar22->super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      psVar22 = (this->super_ChLoadCustomMultiple).loadables.
                super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  peVar5 = psVar22[1].super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar5 == (element_type *)0x0) {
LAB_005ceef3:
    local_478 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_480 = 0;
  }
  else {
    local_480 = __dynamic_cast(peVar5,&ChLoadable::typeinfo,&ChBody::typeinfo,0xffffffffffffffff);
    if (local_480 == 0) goto LAB_005ceef3;
    local_478 = psVar22[1].super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    if (local_478 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_478 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else if (__libc_single_threaded == '\0') {
      LOCK();
      local_478->_M_use_count = local_478->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_478->_M_use_count = local_478->_M_use_count + 1;
    }
  }
  local_220.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_338.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_338.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x0;
  local_338.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_220.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_220.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_220.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&local_128,(ChVector<double> *)&local_338,(ChQuaternion<double> *)&local_220);
  local_338.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  CStack_438.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  CStack_438.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x0;
  CStack_438.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_338.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_338.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_338.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&local_220,(ChVector<double> *)&CStack_438,(ChQuaternion<double> *)&local_338);
  if (state_x == (ChState *)0x0) {
    if (&local_128 != pCVar18) {
      local_128.super_ChFrame<double>.coord.pos.m_data[0] =
           (pCVar18->super_ChFrame<double>).coord.pos.m_data[0];
      local_128.super_ChFrame<double>.coord.pos.m_data[1] =
           (pCVar18->super_ChFrame<double>).coord.pos.m_data[1];
      local_128.super_ChFrame<double>.coord.pos.m_data[2] =
           (pCVar18->super_ChFrame<double>).coord.pos.m_data[2];
    }
    ChFrame<double>::SetCoord
              (&local_220.super_ChFrame<double>,(ChCoordsys<double> *)(local_480 + 0x80));
  }
  else {
    local_338.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         (state_x->super_ChVectorDynamic<double>).
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_338.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_338.super_ChFrame<double>.coord.pos.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.rot.m_data[0] = 0.0;
    local_338.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_x;
    if ((long)local_338.super_ChFrame<double>.coord.rot.m_data[2] < 3) goto LAB_005cf874;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)&CStack_438,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_338,(type *)0x0);
    local_128.super_ChFrame<double>.coord.pos.m_data[0] =
         (double)CStack_438.super_ChFrame<double>._vptr_ChFrame;
    local_128.super_ChFrame<double>.coord.pos.m_data[1] =
         CStack_438.super_ChFrame<double>.coord.pos.m_data[0];
    local_128.super_ChFrame<double>.coord.pos.m_data[2] =
         CStack_438.super_ChFrame<double>.coord.pos.m_data[1];
    CStack_438.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_x->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    CStack_438.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         ((state_x->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 3);
    CStack_438.super_ChFrame<double>.coord.pos.m_data[0] = 3.45845952088873e-323;
    CStack_438.super_ChFrame<double>.coord.rot.m_data[0] = 1.48219693752374e-323;
    CStack_438.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_x;
    if ((long)CStack_438.super_ChFrame<double>.coord.rot.m_data[2] < 10) goto LAB_005cf874;
    ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChCoordsys<double> *)&local_338,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &CStack_438,(type *)0x0);
    ChFrame<double>::SetCoord(&local_220.super_ChFrame<double>,(ChCoordsys<double> *)&local_338);
  }
  if (state_w == (ChStateDelta *)0x0) {
    if (&local_128.coord_dt != (ChCoordsys<double> *)&(pCVar18->super_ChFrame<double>).coord.rot) {
      local_128.coord_dt.pos.m_data[0] = (pCVar18->super_ChFrame<double>).coord.rot.m_data[0];
      local_128.coord_dt.pos.m_data[1] = (pCVar18->super_ChFrame<double>).coord.rot.m_data[1];
      local_128.coord_dt.pos.m_data[2] = (pCVar18->super_ChFrame<double>).coord.rot.m_data[2];
    }
    if (&local_220.coord_dt != (ChCoordsys<double> *)(local_480 + 0x100)) {
      local_220.coord_dt.pos.m_data[0] = *(double *)(local_480 + 0x100);
      local_220.coord_dt.pos.m_data[1] = *(double *)(local_480 + 0x108);
      local_220.coord_dt.pos.m_data[2] = *(double *)(local_480 + 0x110);
      local_220.coord_dt.rot.m_data[0] = *(double *)(local_480 + 0x118);
      local_220.coord_dt.rot.m_data[1] = *(double *)(local_480 + 0x120);
      local_220.coord_dt.rot.m_data[2] = *(double *)(local_480 + 0x128);
      local_220.coord_dt.rot.m_data[3] = *(double *)(local_480 + 0x130);
    }
  }
  else {
    local_338.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         (state_w->super_ChVectorDynamic<double>).
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_338.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_338.super_ChFrame<double>.coord.pos.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.rot.m_data[0] = 0.0;
    local_338.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_w;
    if ((long)local_338.super_ChFrame<double>.coord.rot.m_data[2] < 3) goto LAB_005cf874;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)&CStack_438,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_338,(type *)0x0);
    local_128.coord_dt.pos.m_data[0] = (double)CStack_438.super_ChFrame<double>._vptr_ChFrame;
    local_128.coord_dt.pos.m_data[1] = CStack_438.super_ChFrame<double>.coord.pos.m_data[0];
    local_128.coord_dt.pos.m_data[2] = CStack_438.super_ChFrame<double>.coord.pos.m_data[1];
    local_338.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_338.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         ((state_w->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 3);
    local_338.super_ChFrame<double>.coord.pos.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.rot.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_w;
    if ((long)local_338.super_ChFrame<double>.coord.rot.m_data[2] < 6) goto LAB_005cf874;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)&CStack_438,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_338,(type *)0x0);
    local_220.coord_dt.pos.m_data[0] = (double)CStack_438.super_ChFrame<double>._vptr_ChFrame;
    local_220.coord_dt.pos.m_data[1] = CStack_438.super_ChFrame<double>.coord.pos.m_data[0];
    local_220.coord_dt.pos.m_data[2] = CStack_438.super_ChFrame<double>.coord.pos.m_data[1];
    local_338.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_338.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         ((state_w->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 6);
    local_338.super_ChFrame<double>.coord.pos.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.rot.m_data[0] = 2.96439387504748e-323;
    local_338.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_w;
    if ((long)local_338.super_ChFrame<double>.coord.rot.m_data[2] < 9) goto LAB_005cf874;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)&CStack_438,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_338,(type *)0x0);
    ChFrameMoving<double>::SetWvel_loc(&local_220,(ChVector<double> *)&CStack_438);
  }
  ChFrameMoving<double>::operator=(&this->frame_Aw,&local_128);
  CStack_438.super_ChFrame<double>.coord.pos.m_data[0] =
       (this->loc_application_B).coord.pos.m_data[0];
  CStack_438.super_ChFrame<double>.coord.pos.m_data[1] =
       (this->loc_application_B).coord.pos.m_data[1];
  CStack_438.super_ChFrame<double>.coord.pos.m_data[2] =
       (this->loc_application_B).coord.pos.m_data[2];
  CStack_438.super_ChFrame<double>.coord.rot.m_data[0] =
       (this->loc_application_B).coord.rot.m_data[0];
  CStack_438.super_ChFrame<double>.coord.rot.m_data[1] =
       (this->loc_application_B).coord.rot.m_data[1];
  CStack_438.super_ChFrame<double>.coord.rot.m_data[2] =
       (this->loc_application_B).coord.rot.m_data[2];
  CStack_438.super_ChFrame<double>.coord.rot.m_data[3] =
       (this->loc_application_B).coord.rot.m_data[3];
  CStack_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  CStack_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  CStack_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  CStack_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  CStack_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  CStack_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  CStack_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  CStack_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  CStack_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_458.m_data[0] = 1.0;
  CStack_438.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b036f0;
  CStack_438.coord_dt.pos.m_data[0] = 0.0;
  CStack_438.coord_dt.pos.m_data[1] = 0.0;
  CStack_438.coord_dt.pos.m_data[2] = 0.0;
  CStack_438.coord_dt.rot.m_data[0] = 0.0;
  CStack_438.coord_dt.rot.m_data[1] = 0.0;
  CStack_438.coord_dt.rot.m_data[2] = 0.0;
  CStack_438.coord_dt.rot.m_data[3] = 0.0;
  CStack_438.coord_dtdt.pos.m_data[0] = 0.0;
  CStack_438.coord_dtdt.pos.m_data[1] = 0.0;
  CStack_438.coord_dtdt.pos.m_data[2] = 0.0;
  CStack_438.coord_dtdt.rot.m_data[0] = 0.0;
  CStack_438.coord_dtdt.rot.m_data[1] = 0.0;
  CStack_438.coord_dtdt.rot.m_data[2] = 0.0;
  CStack_438.coord_dtdt.rot.m_data[3] = 0.0;
  local_238.m_data[2] = 0.0;
  local_458.m_data[3] = 0.0;
  local_238.m_data[0] = 0.0;
  local_238.m_data[1] = 0.0;
  local_458.m_data[1] = 0.0;
  local_458.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&local_338,&local_238,&local_458);
  ChFrameMoving<double>::TransformLocalToParent(&local_220,&CStack_438,&local_338);
  ChFrameMoving<double>::operator=(&this->frame_Bw,&local_338);
  CStack_438.super_ChFrame<double>.coord.pos.m_data[0] =
       (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[0];
  CStack_438.super_ChFrame<double>.coord.pos.m_data[1] =
       (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[1];
  CStack_438.super_ChFrame<double>.coord.pos.m_data[2] =
       (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[2];
  CStack_438.super_ChFrame<double>.coord.rot.m_data[0] =
       (this->frame_Bw).super_ChFrame<double>.coord.rot.m_data[0];
  CStack_438.super_ChFrame<double>.coord.rot.m_data[1] =
       (this->frame_Bw).super_ChFrame<double>.coord.rot.m_data[1];
  CStack_438.super_ChFrame<double>.coord.rot.m_data[2] =
       (this->frame_Bw).super_ChFrame<double>.coord.rot.m_data[2];
  CStack_438.super_ChFrame<double>.coord.rot.m_data[3] =
       (this->frame_Bw).super_ChFrame<double>.coord.rot.m_data[3];
  CStack_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  CStack_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  CStack_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  CStack_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  CStack_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  CStack_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  CStack_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  CStack_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  CStack_438.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  CStack_438.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b036f0;
  CStack_438.coord_dt.pos.m_data[0] = (this->frame_Bw).coord_dt.pos.m_data[0];
  CStack_438.coord_dt.pos.m_data[1] = (this->frame_Bw).coord_dt.pos.m_data[1];
  CStack_438.coord_dt.pos.m_data[2] = (this->frame_Bw).coord_dt.pos.m_data[2];
  CStack_438.coord_dt.rot.m_data[0] = (this->frame_Bw).coord_dt.rot.m_data[0];
  CStack_438.coord_dt.rot.m_data[1] = (this->frame_Bw).coord_dt.rot.m_data[1];
  CStack_438.coord_dt.rot.m_data[2] = (this->frame_Bw).coord_dt.rot.m_data[2];
  CStack_438.coord_dt.rot.m_data[3] = (this->frame_Bw).coord_dt.rot.m_data[3];
  CStack_438.coord_dtdt.pos.m_data[0] = (this->frame_Bw).coord_dtdt.pos.m_data[0];
  CStack_438.coord_dtdt.pos.m_data[1] = (this->frame_Bw).coord_dtdt.pos.m_data[1];
  CStack_438.coord_dtdt.pos.m_data[2] = (this->frame_Bw).coord_dtdt.pos.m_data[2];
  CStack_438.coord_dtdt.rot.m_data[0] = (this->frame_Bw).coord_dtdt.rot.m_data[0];
  CStack_438.coord_dtdt.rot.m_data[1] = (this->frame_Bw).coord_dtdt.rot.m_data[1];
  CStack_438.coord_dtdt.rot.m_data[2] = (this->frame_Bw).coord_dtdt.rot.m_data[2];
  CStack_438.coord_dtdt.rot.m_data[3] = (this->frame_Bw).coord_dtdt.rot.m_data[3];
  ChFrameMoving<double>::Invert(&CStack_438);
  local_458.m_data[0] = 1.0;
  local_238.m_data[0] = 0.0;
  local_238.m_data[1] = 0.0;
  local_238.m_data[2] = 0.0;
  local_458.m_data[1] = 0.0;
  local_458.m_data[2] = 0.0;
  local_458.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&local_338,&local_238,&local_458);
  ChFrameMoving<double>::TransformLocalToParent(&CStack_438,&this->frame_Aw,&local_338);
  (*(this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj[0x16])
            (this,&local_338,&this->computed_loc_force);
  dVar40 = (this->computed_loc_force).m_data[1];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = (this->computed_loc_force).m_data[0];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = (this->computed_loc_force).m_data[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       dVar40 * (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
  auVar2 = vfmadd231sd_fma(auVar48,auVar35,auVar2);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       dVar40 * (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar25 = vfmadd231sd_fma(auVar53,auVar35,auVar25);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       dVar40 * (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
  auVar3 = vfmadd231sd_fma(auVar41,auVar35,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar2 = vfmadd231sd_fma(auVar2,auVar44,auVar4);
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar25 = vfmadd231sd_fma(auVar25,auVar44,auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar3 = vfmadd231sd_fma(auVar3,auVar44,auVar27);
  pp_Var47 = auVar2._0_8_;
  CStack_438.super_ChFrame<double>._vptr_ChFrame = pp_Var47;
  dVar51 = auVar25._0_8_;
  CStack_438.super_ChFrame<double>.coord.pos.m_data[0] = dVar51;
  dVar40 = auVar3._0_8_;
  CStack_438.super_ChFrame<double>.coord.pos.m_data[1] = dVar40;
  uVar24 = (this->super_ChLoadCustomMultiple).load_Q.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if ((long)uVar24 < 3) goto LAB_005cf874;
  __dest = (this->super_ChLoadCustomMultiple).load_Q.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  uVar21 = 3;
  if (((ulong)__dest & 7) == 0) {
    uVar17 = -((uint)((ulong)__dest >> 3) & 0x1fffffff) & 7;
    if (uVar17 < 3) {
      uVar21 = uVar17;
    }
    if (uVar17 != 0) goto LAB_005cf547;
  }
  else {
LAB_005cf547:
    memcpy(__dest,&CStack_438,(ulong)(uVar21 * 8));
  }
  if (uVar21 < 3) {
    uVar23 = (ulong)(uVar21 << 3);
    memcpy((void *)((long)__dest + uVar23),
           (void *)((long)CStack_438.super_ChFrame<double>.coord.pos.m_data + (uVar23 - 8)),
           0x18 - uVar23);
  }
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar51;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar40;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = pp_Var47;
  auVar35 = ZEXT816(0x4000000000000000);
  dVar13 = (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[2] -
           local_220.super_ChFrame<double>.coord.pos.m_data[2];
  dVar34 = (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[1] -
           local_220.super_ChFrame<double>.coord.pos.m_data[1];
  dVar52 = (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[0] -
           local_220.super_ChFrame<double>.coord.pos.m_data[0];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar34;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = dVar51 * dVar13;
  auVar3 = vfmsub231sd_fma(auVar49,auVar42,auVar54);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar52;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = (double)pp_Var47 * dVar34;
  auVar4 = vfmsub231sd_fma(auVar43,auVar36,auVar58);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_220.super_ChFrame<double>.coord.rot.m_data[0];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar13;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar40 * dVar52;
  auVar2 = vfmsub231sd_fma(auVar55,auVar57,auVar45);
  local_220.super_ChFrame<double>.coord.rot.m_data[0] =
       local_220.super_ChFrame<double>.coord.rot.m_data[0] *
       local_220.super_ChFrame<double>.coord.rot.m_data[0];
  auVar14._8_8_ = 0x8000000000000000;
  auVar14._0_8_ = 0x8000000000000000;
  auVar25 = vxorpd_avx512vl(auVar37,auVar14);
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       local_220.super_ChFrame<double>.coord.rot.m_data[2] *
       local_220.super_ChFrame<double>.coord.rot.m_data[2] +
       local_220.super_ChFrame<double>.coord.rot.m_data[0];
  auVar26 = vfmadd213sd_avx512f(auVar61,auVar35,ZEXT816(0xbff0000000000000));
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       local_220.super_ChFrame<double>.coord.rot.m_data[0] +
       local_220.super_ChFrame<double>.coord.rot.m_data[1] *
       local_220.super_ChFrame<double>.coord.rot.m_data[1];
  auVar27 = vfmadd213sd_avx512f(auVar59,auVar35,ZEXT816(0xbff0000000000000));
  dVar34 = auVar25._0_8_;
  dVar52 = auVar2._0_8_;
  dVar51 = local_220.super_ChFrame<double>.coord.rot.m_data[1] *
           local_220.super_ChFrame<double>.coord.rot.m_data[2] -
           local_220.super_ChFrame<double>.coord.rot.m_data[3] * dVar34;
  dVar40 = local_220.super_ChFrame<double>.coord.rot.m_data[1] *
           local_220.super_ChFrame<double>.coord.rot.m_data[2] +
           local_220.super_ChFrame<double>.coord.rot.m_data[3] * dVar34;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar40 + dVar40;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = auVar26._0_8_ * dVar52;
  auVar2 = vfmadd231sd_fma(auVar62,auVar3,auVar38);
  dVar13 = local_220.super_ChFrame<double>.coord.rot.m_data[3] *
           local_220.super_ChFrame<double>.coord.rot.m_data[2] -
           local_220.super_ChFrame<double>.coord.rot.m_data[1] * dVar34;
  dVar40 = local_220.super_ChFrame<double>.coord.rot.m_data[1] * dVar34 +
           local_220.super_ChFrame<double>.coord.rot.m_data[3] *
           local_220.super_ChFrame<double>.coord.rot.m_data[2];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = (dVar51 + dVar51) * dVar52;
  auVar25 = vfmadd231sd_fma(auVar63,auVar3,auVar27);
  dVar51 = local_220.super_ChFrame<double>.coord.rot.m_data[2] * dVar34 +
           local_220.super_ChFrame<double>.coord.rot.m_data[3] *
           local_220.super_ChFrame<double>.coord.rot.m_data[1];
  dVar34 = local_220.super_ChFrame<double>.coord.rot.m_data[3] *
           local_220.super_ChFrame<double>.coord.rot.m_data[1] -
           local_220.super_ChFrame<double>.coord.rot.m_data[2] * dVar34;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar13 + dVar13;
  auVar2 = vfmadd213sd_fma(auVar39,auVar4,auVar2);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar34 + dVar34;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar52 * (dVar40 + dVar40);
  auVar3 = vfmadd231sd_fma(auVar56,auVar3,auVar46);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar51 + dVar51;
  auVar25 = vfmadd213sd_fma(auVar60,auVar4,auVar25);
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       local_220.super_ChFrame<double>.coord.rot.m_data[3] *
       local_220.super_ChFrame<double>.coord.rot.m_data[3] +
       local_220.super_ChFrame<double>.coord.rot.m_data[0];
  auVar26 = vfmadd213sd_avx512f(auVar50,auVar35,ZEXT816(0xbff0000000000000));
  local_458.m_data[0] = auVar25._0_8_;
  local_458.m_data[1] = auVar2._0_8_;
  auVar3 = vfmadd213sd_fma(auVar26,auVar4,auVar3);
  local_458.m_data[2] = auVar3._0_8_;
  if (uVar24 < 6) goto LAB_005cf874;
  pdVar20 = __dest + 3;
  uVar21 = 3;
  if (((ulong)pdVar20 & 7) == 0) {
    uVar17 = -((uint)((ulong)pdVar20 >> 3) & 0x1fffffff) & 7;
    if (uVar17 < 3) {
      uVar21 = uVar17;
    }
    if (uVar17 != 0) goto LAB_005cf703;
  }
  else {
LAB_005cf703:
    auVar31 = vpbroadcastq_avx512f();
    uVar23 = vpcmpuq_avx512f(auVar31,_DAT_00969dc0,5);
    auVar32._8_8_ =
         (ulong)((byte)(uVar23 >> 1) & 1) *
         (long)CStack_438.super_ChFrame<double>.coord.pos.m_data[0];
    auVar32._0_8_ = (ulong)((byte)uVar23 & 1) * (long)CStack_438.super_ChFrame<double>._vptr_ChFrame
    ;
    auVar32._16_8_ =
         (ulong)((byte)(uVar23 >> 2) & 1) *
         (long)CStack_438.super_ChFrame<double>.coord.pos.m_data[1];
    auVar32._24_8_ =
         (ulong)((byte)(uVar23 >> 3) & 1) *
         (long)CStack_438.super_ChFrame<double>.coord.pos.m_data[2];
    auVar32._32_8_ =
         (ulong)((byte)(uVar23 >> 4) & 1) *
         (long)CStack_438.super_ChFrame<double>.coord.rot.m_data[0];
    auVar32._40_8_ =
         (ulong)((byte)(uVar23 >> 5) & 1) *
         (long)CStack_438.super_ChFrame<double>.coord.rot.m_data[1];
    auVar32._48_8_ =
         (ulong)((byte)(uVar23 >> 6) & 1) *
         (long)CStack_438.super_ChFrame<double>.coord.rot.m_data[2];
    auVar32._56_8_ = (uVar23 >> 7) * (long)CStack_438.super_ChFrame<double>.coord.rot.m_data[3];
    auVar31._8_8_ = 0x8000000000000000;
    auVar31._0_8_ = 0x8000000000000000;
    auVar31._16_8_ = 0x8000000000000000;
    auVar31._24_8_ = 0x8000000000000000;
    auVar31._32_8_ = 0x8000000000000000;
    auVar31._40_8_ = 0x8000000000000000;
    auVar31._48_8_ = 0x8000000000000000;
    auVar31._56_8_ = 0x8000000000000000;
    auVar31 = vxorpd_avx512dq(auVar32,auVar31);
    bVar6 = (bool)((byte)uVar23 & 1);
    bVar7 = (bool)((byte)(uVar23 >> 1) & 1);
    bVar8 = (bool)((byte)(uVar23 >> 2) & 1);
    bVar9 = (bool)((byte)(uVar23 >> 3) & 1);
    bVar10 = (bool)((byte)(uVar23 >> 4) & 1);
    bVar11 = (bool)((byte)(uVar23 >> 5) & 1);
    bVar12 = (bool)((byte)(uVar23 >> 6) & 1);
    *pdVar20 = (double)((ulong)bVar6 * auVar31._0_8_ | (ulong)!bVar6 * (long)*pdVar20);
    __dest[4] = (double)((ulong)bVar7 * auVar31._8_8_ | (ulong)!bVar7 * (long)__dest[4]);
    __dest[5] = (double)((ulong)bVar8 * auVar31._16_8_ | (ulong)!bVar8 * (long)__dest[5]);
    __dest[6] = (double)((ulong)bVar9 * auVar31._24_8_ | (ulong)!bVar9 * (long)__dest[6]);
    __dest[7] = (double)((ulong)bVar10 * auVar31._32_8_ | (ulong)!bVar10 * (long)__dest[7]);
    __dest[8] = (double)((ulong)bVar11 * auVar31._40_8_ | (ulong)!bVar11 * (long)__dest[8]);
    __dest[9] = (double)((ulong)bVar12 * auVar31._48_8_ | (ulong)!bVar12 * (long)__dest[9]);
    __dest[10] = (double)((uVar23 >> 7) * auVar31._56_8_ |
                         (ulong)!SUB81(uVar23 >> 7,0) * (long)__dest[10]);
  }
  if (uVar21 < 3) {
    uVar19 = (ulong)(uVar21 << 3);
    auVar28 = vpbroadcastq_avx512vl();
    uVar23 = vpcmpuq_avx512vl(auVar28,_DAT_00955380,5);
    uVar23 = uVar23 & 0xf;
    auVar29._8_8_ =
         (ulong)((byte)(uVar23 >> 1) & 1) *
         *(long *)((long)CStack_438.super_ChFrame<double>.coord.pos.m_data + uVar19);
    auVar29._0_8_ =
         (ulong)((byte)uVar23 & 1) *
         *(long *)((long)CStack_438.super_ChFrame<double>.coord.pos.m_data + (uVar19 - 8));
    auVar29._16_8_ =
         (ulong)((byte)(uVar23 >> 2) & 1) *
         *(long *)((long)CStack_438.super_ChFrame<double>.coord.pos.m_data + uVar19 + 8);
    auVar29._24_8_ =
         (uVar23 >> 3) *
         *(long *)((long)CStack_438.super_ChFrame<double>.coord.pos.m_data + uVar19 + 0x10);
    auVar28._8_8_ = 0x8000000000000000;
    auVar28._0_8_ = 0x8000000000000000;
    auVar28._16_8_ = 0x8000000000000000;
    auVar28._24_8_ = 0x8000000000000000;
    auVar28 = vxorpd_avx512vl(auVar29,auVar28);
    puVar1 = (ulong *)((long)pdVar20 + uVar19);
    bVar6 = (bool)((byte)uVar23 & 1);
    bVar7 = (bool)((byte)(uVar23 >> 1) & 1);
    bVar8 = (bool)((byte)(uVar23 >> 2) & 1);
    *puVar1 = (ulong)bVar6 * auVar28._0_8_ | (ulong)!bVar6 * *puVar1;
    puVar1[1] = (ulong)bVar7 * auVar28._8_8_ | (ulong)!bVar7 * puVar1[1];
    puVar1[2] = (ulong)bVar8 * auVar28._16_8_ | (ulong)!bVar8 * puVar1[2];
    puVar1[3] = (uVar23 >> 3) * auVar28._24_8_ | (ulong)!SUB81(uVar23 >> 3,0) * puVar1[3];
  }
  if ((long)uVar24 < 9) {
LAB_005cf874:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar20 = __dest + 6;
  uVar21 = 3;
  if (((ulong)pdVar20 & 7) == 0) {
    uVar17 = -((uint)((ulong)pdVar20 >> 3) & 0x1fffffff) & 7;
    if (uVar17 < 3) {
      uVar21 = uVar17;
    }
    if (uVar17 == 0) goto LAB_005cf7d2;
  }
  auVar31 = vpbroadcastq_avx512f();
  uVar24 = vpcmpuq_avx512f(auVar31,_DAT_00969dc0,5);
  auVar33._8_8_ = (ulong)((byte)(uVar24 >> 1) & 1) * (long)auVar2._0_8_;
  auVar33._0_8_ = (ulong)((byte)uVar24 & 1) * (long)auVar25._0_8_;
  auVar33._16_8_ = (ulong)((byte)(uVar24 >> 2) & 1) * (long)auVar3._0_8_;
  auVar33._24_8_ = (ulong)((byte)(uVar24 >> 3) & 1) * (long)local_458.m_data[3];
  auVar33._32_8_ =
       (ulong)((byte)(uVar24 >> 4) & 1) * (long)CStack_438.super_ChFrame<double>._vptr_ChFrame;
  auVar33._40_8_ =
       (ulong)((byte)(uVar24 >> 5) & 1) * (long)CStack_438.super_ChFrame<double>.coord.pos.m_data[0]
  ;
  auVar33._48_8_ =
       (ulong)((byte)(uVar24 >> 6) & 1) * (long)CStack_438.super_ChFrame<double>.coord.pos.m_data[1]
  ;
  auVar33._56_8_ = (uVar24 >> 7) * (long)CStack_438.super_ChFrame<double>.coord.pos.m_data[2];
  auVar16._8_8_ = 0x8000000000000000;
  auVar16._0_8_ = 0x8000000000000000;
  auVar16._16_8_ = 0x8000000000000000;
  auVar16._24_8_ = 0x8000000000000000;
  auVar16._32_8_ = 0x8000000000000000;
  auVar16._40_8_ = 0x8000000000000000;
  auVar16._48_8_ = 0x8000000000000000;
  auVar16._56_8_ = 0x8000000000000000;
  auVar31 = vxorpd_avx512dq(auVar33,auVar16);
  bVar6 = (bool)((byte)uVar24 & 1);
  bVar7 = (bool)((byte)(uVar24 >> 1) & 1);
  bVar8 = (bool)((byte)(uVar24 >> 2) & 1);
  bVar9 = (bool)((byte)(uVar24 >> 3) & 1);
  bVar10 = (bool)((byte)(uVar24 >> 4) & 1);
  bVar11 = (bool)((byte)(uVar24 >> 5) & 1);
  bVar12 = (bool)((byte)(uVar24 >> 6) & 1);
  *pdVar20 = (double)((ulong)bVar6 * auVar31._0_8_ | (ulong)!bVar6 * (long)*pdVar20);
  __dest[7] = (double)((ulong)bVar7 * auVar31._8_8_ | (ulong)!bVar7 * (long)__dest[7]);
  __dest[8] = (double)((ulong)bVar8 * auVar31._16_8_ | (ulong)!bVar8 * (long)__dest[8]);
  __dest[9] = (double)((ulong)bVar9 * auVar31._24_8_ | (ulong)!bVar9 * (long)__dest[9]);
  __dest[10] = (double)((ulong)bVar10 * auVar31._32_8_ | (ulong)!bVar10 * (long)__dest[10]);
  __dest[0xb] = (double)((ulong)bVar11 * auVar31._40_8_ | (ulong)!bVar11 * (long)__dest[0xb]);
  __dest[0xc] = (double)((ulong)bVar12 * auVar31._48_8_ | (ulong)!bVar12 * (long)__dest[0xc]);
  __dest[0xd] = (double)((uVar24 >> 7) * auVar31._56_8_ |
                        (ulong)!SUB81(uVar24 >> 7,0) * (long)__dest[0xd]);
LAB_005cf7d2:
  if (uVar21 < 3) {
    uVar23 = (ulong)(uVar21 << 3);
    auVar28 = vpbroadcastq_avx512vl();
    uVar24 = vpcmpuq_avx512vl(auVar28,_DAT_00955380,5);
    uVar24 = uVar24 & 0xf;
    auVar30._8_8_ =
         (ulong)((byte)(uVar24 >> 1) & 1) * *(long *)((long)local_458.m_data + uVar23 + 8);
    auVar30._0_8_ = (ulong)((byte)uVar24 & 1) * *(long *)((long)local_458.m_data + uVar23);
    auVar30._16_8_ =
         (ulong)((byte)(uVar24 >> 2) & 1) * *(long *)((long)local_458.m_data + uVar23 + 0x10);
    auVar30._24_8_ = (uVar24 >> 3) * *(long *)((long)local_458.m_data + uVar23 + 0x18);
    auVar15._8_8_ = 0x8000000000000000;
    auVar15._0_8_ = 0x8000000000000000;
    auVar15._16_8_ = 0x8000000000000000;
    auVar15._24_8_ = 0x8000000000000000;
    auVar28 = vxorpd_avx512vl(auVar30,auVar15);
    puVar1 = (ulong *)((long)pdVar20 + uVar23);
    bVar6 = (bool)((byte)uVar24 & 1);
    bVar7 = (bool)((byte)(uVar24 >> 1) & 1);
    bVar8 = (bool)((byte)(uVar24 >> 2) & 1);
    *puVar1 = (ulong)bVar6 * auVar28._0_8_ | (ulong)!bVar6 * *puVar1;
    puVar1[1] = (ulong)bVar7 * auVar28._8_8_ | (ulong)!bVar7 * puVar1[1];
    puVar1[2] = (ulong)bVar8 * auVar28._16_8_ | (ulong)!bVar8 * puVar1[2];
    puVar1[3] = (uVar24 >> 3) * auVar28._24_8_ | (ulong)!SUB81(uVar24 >> 3,0) * puVar1[3];
  }
  if (local_478 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_478);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void ChLoadXYZnodeBody::ComputeQ(ChState* state_x, ChStateDelta* state_w) {
    auto mnodeA = std::dynamic_pointer_cast<ChNodeXYZ>(this->loadables[0]);
    auto mbodyB = std::dynamic_pointer_cast<ChBody>(this->loadables[1]);

    ChFrameMoving<> bodycoordA, bodycoordB;
    if (state_x) {
        // the numerical jacobian algo might change state_x
        bodycoordA.SetPos(state_x->segment(0, 3));
        bodycoordB.SetCoord(state_x->segment(3, 7));
    } else {
        bodycoordA.SetPos(mnodeA->pos);
        bodycoordB.SetCoord(mbodyB->coord);
    }

    if (state_w) {
        // the numerical jacobian algo might change state_w
        bodycoordA.SetPos_dt(state_w->segment(0, 3));
        bodycoordB.SetPos_dt(state_w->segment(3, 3));
        bodycoordB.SetWvel_loc(state_w->segment(6, 3));
    } else {
        bodycoordA.SetPos_dt(mnodeA->GetPos_dt());
        bodycoordB.SetCoord_dt(mbodyB->GetCoord_dt());
    }

    frame_Aw = bodycoordA;
    frame_Bw = ChFrameMoving<>(loc_application_B) >> bodycoordB;
    ChFrameMoving<> rel_AB = frame_Aw >> frame_Bw.GetInverse();

    // COMPUTE THE FORCE

    ComputeForce(rel_AB, computed_loc_force);

    ChVector<> abs_force = frame_Bw.TransformDirectionLocalToParent(computed_loc_force);

    // Compute Q
    load_Q.segment(0, 3) = abs_force.eigen();

    ChVector<> loc_ftorque = bodycoordB.GetRot().RotateBack(((frame_Bw.GetPos() - bodycoordB.GetPos()) % abs_force));
    load_Q.segment(3, 3) = -abs_force.eigen();
    load_Q.segment(6, 3) = -loc_ftorque.eigen();
}